

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ReporterRegistrar<Catch::ConsoleReporter>::ReporterRegistrar
          (ReporterRegistrar<Catch::ConsoleReporter> *this,string *name)

{
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  pSVar1 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  clara::std::make_shared<Catch::ReporterRegistrar<Catch::ConsoleReporter>::ReporterFactory>();
  _Stack_30._M_pi = _Stack_40._M_pi;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*(pSVar1->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub[2])
            (&(pSVar1->super_RegistryHub).super_IMutableRegistryHub,name,local_38);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  return;
}

Assistant:

explicit ReporterRegistrar( std::string const& name ) {
            getMutableRegistryHub().registerReporter( name, std::make_shared<ReporterFactory>() );
        }